

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_releaseBuffer(ZSTDMT_bufferPool *bufPool,buffer_t buf)

{
  uint uVar1;
  void *ptr;
  
  ptr = buf.start;
  if (ptr != (void *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)bufPool);
    uVar1 = bufPool->nbBuffers;
    if (uVar1 < bufPool->totalBuffers) {
      bufPool->nbBuffers = uVar1 + 1;
      bufPool->bTable[uVar1].start = ptr;
      bufPool->bTable[uVar1].capacity = buf.capacity;
      pthread_mutex_unlock((pthread_mutex_t *)bufPool);
      return;
    }
    pthread_mutex_unlock((pthread_mutex_t *)bufPool);
    ZSTD_customFree(ptr,bufPool->cMem);
  }
  return;
}

Assistant:

static void ZSTDMT_releaseBuffer(ZSTDMT_bufferPool* bufPool, buffer_t buf)
{
    DEBUGLOG(5, "ZSTDMT_releaseBuffer");
    if (buf.start == NULL) return;   /* compatible with release on NULL */
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    if (bufPool->nbBuffers < bufPool->totalBuffers) {
        bufPool->bTable[bufPool->nbBuffers++] = buf;  /* stored for later use */
        DEBUGLOG(5, "ZSTDMT_releaseBuffer: stored buffer of size %u in slot %u",
                    (U32)buf.capacity, (U32)(bufPool->nbBuffers-1));
        ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
        return;
    }
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
    /* Reached bufferPool capacity (should not happen) */
    DEBUGLOG(5, "ZSTDMT_releaseBuffer: pool capacity reached => freeing ");
    ZSTD_customFree(buf.start, bufPool->cMem);
}